

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_index_entry.cpp
# Opt level: O3

void __thiscall
duckdb::IndexDataTableInfo::IndexDataTableInfo
          (IndexDataTableInfo *this,shared_ptr<duckdb::DataTableInfo,_true> *info_p,
          string *index_name_p)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  (this->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = *(undefined4 *)
           &(info_p->internal).super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  uVar3 = *(undefined4 *)
           ((long)&(info_p->internal).
                   super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
  ;
  uVar4 = *(undefined4 *)
           &(info_p->internal).super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  uVar5 = *(undefined4 *)
           ((long)&(info_p->internal).
                   super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi + 4);
  (info_p->internal).super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   &(this->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = uVar2;
  *(undefined4 *)
   ((long)&(this->info).internal.
           super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar3
  ;
  *(undefined4 *)
   &(this->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = uVar4;
  *(undefined4 *)
   ((long)&(this->info).internal.
           super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
   4) = uVar5;
  (info_p->internal).super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->index_name)._M_dataplus._M_p = (pointer)&(this->index_name).field_2;
  pcVar1 = (index_name_p->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->index_name,pcVar1,pcVar1 + index_name_p->_M_string_length);
  return;
}

Assistant:

IndexDataTableInfo::IndexDataTableInfo(shared_ptr<DataTableInfo> info_p, const string &index_name_p)
    : info(std::move(info_p)), index_name(index_name_p) {
}